

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O1

void EntityRelationTask::entity_first_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions,bool isLdf)

{
  long lVar1;
  pointer ppeVar2;
  size_t sVar3;
  ulong uVar4;
  v_array<unsigned_long> *pvVar5;
  v_array<unsigned_long> *extraout_RDX;
  v_array<unsigned_long> *extraout_RDX_00;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  lVar1 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          (1 - (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  auVar9._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar9._0_8_ = lVar1;
  auVar9._12_4_ = 0x45300000;
  dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  ppeVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    uVar4 = (ulong)(dVar8 + -1.0);
    pvVar5 = (v_array<unsigned_long> *)((long)uVar4 >> 0x3f);
    uVar7 = (long)((dVar8 + -1.0) - 9.223372036854776e+18) & (ulong)pvVar5;
    uVar6 = 0;
    do {
      if (uVar6 < (uVar7 | uVar4) >> 1) {
        sVar3 = predict_entity(sch,ppeVar2[uVar6],pvVar5,(ptag)uVar6,isLdf);
        pvVar5 = extraout_RDX;
      }
      else {
        sVar3 = predict_relation(sch,ppeVar2[uVar6],predictions,(ptag)uVar6,isLdf);
        pvVar5 = extraout_RDX_00;
      }
      predictions->_begin[uVar6] = sVar3;
      uVar6 = uVar6 + 1;
      ppeVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3));
  }
  return;
}

Assistant:

void entity_first_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions, bool isLdf = false)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  size_t n_ent = (size_t)(sqrt(ec.size() * 8 + 1) - 1) / 2;
  // Do entity recognition first
  for (size_t i = 0; i < ec.size(); i++)
  {
    if (i < n_ent)
      predictions[i] = predict_entity(sch, ec[i], predictions, (ptag)i, isLdf);
    else
      predictions[i] = predict_relation(sch, ec[i], predictions, (ptag)i, isLdf);
  }
}